

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::destroyNullHandleSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  PFN_vkAllocationFunction *pp_Var1;
  InstanceDriver *this;
  VkAllocationCallbacks *allocator;
  AllocationCallbackRecorder recordingAllocator;
  InstanceHelper instHelper;
  long *local_250;
  long local_248;
  long local_240 [2];
  AllocationCallbackRecorder local_230;
  InstanceHelper local_1d0;
  
  InstanceHelper::InstanceHelper(&local_1d0,context,wsiType,(VkAllocationCallbacks *)0x0);
  this = &local_1d0.vki;
  ::vk::InstanceDriver::destroySurfaceKHR
            (this,local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)0x0,(VkAllocationCallbacks *)0x0);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_230,allocator,1);
  ::vk::InstanceDriver::destroySurfaceKHR
            (this,local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)0x0,
             &local_230.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  if (local_230.m_records.m_numElements == 0) {
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_230);
    pp_Var1 = &local_230.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    local_230.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"Destroying a VK_NULL_HANDLE surface has no effect","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_230.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks,
               (undefined1 *)
               ((long)local_230.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.
                      pUserData +
               (long)local_230.super_ChainedAllocator.super_AllocationCallbacks.
                     _vptr_AllocationCallbacks));
    if ((PFN_vkAllocationFunction *)
        local_230.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks !=
        pp_Var1) {
      operator_delete(local_230.super_ChainedAllocator.super_AllocationCallbacks.
                      _vptr_AllocationCallbacks,
                      (ulong)(local_230.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks
                              .pfnAllocation + 1));
    }
  }
  else {
    local_250 = local_240;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"Implementation allocated/freed the memory","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_250,
               local_248 + (long)local_250);
    if (local_250 != local_240) {
      operator_delete(local_250,local_240[0] + 1);
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_230);
  }
  ::vk::InstanceDriver::~InstanceDriver(this);
  if (local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
    (*local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  }
  local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
  local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_1d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1d0.supportedExtensions.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.supportedExtensions.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus destroyNullHandleSurfaceTest (Context& context, Type wsiType)
{
	const InstanceHelper	instHelper	(context, wsiType);
	const VkSurfaceKHR		nullHandle	= DE_NULL;

	// Default allocator
	instHelper.vki.destroySurfaceKHR(*instHelper.instance, nullHandle, DE_NULL);

	// Custom allocator
	{
		AllocationCallbackRecorder	recordingAllocator	(getSystemAllocator(), 1u);

		instHelper.vki.destroySurfaceKHR(*instHelper.instance, nullHandle, recordingAllocator.getCallbacks());

		if (recordingAllocator.getNumRecords() != 0u)
			return tcu::TestStatus::fail("Implementation allocated/freed the memory");
	}

	return tcu::TestStatus::pass("Destroying a VK_NULL_HANDLE surface has no effect");
}